

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O2

size_t jsonminify(uint8_t *buf,size_t len,uint8_t *out)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  size_t __n;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  uint8_t buffer [64];
  
  pauVar15 = (undefined1 (*) [16])out;
  if (len < 0x40) {
    uVar9 = 0;
    uVar12 = 0;
    uVar13 = 0;
  }
  else {
    auVar16[8] = 0x5c;
    auVar16._0_8_ = 0x5c5c5c5c5c5c5c5c;
    auVar16[9] = 0x5c;
    auVar16[10] = 0x5c;
    auVar16[0xb] = 0x5c;
    auVar16[0xc] = 0x5c;
    auVar16[0xd] = 0x5c;
    auVar16[0xe] = 0x5c;
    auVar16[0xf] = 0x5c;
    auVar16[0x10] = 0x5c;
    auVar16[0x11] = 0x5c;
    auVar16[0x12] = 0x5c;
    auVar16[0x13] = 0x5c;
    auVar16[0x14] = 0x5c;
    auVar16[0x15] = 0x5c;
    auVar16[0x16] = 0x5c;
    auVar16[0x17] = 0x5c;
    auVar16[0x18] = 0x5c;
    auVar16[0x19] = 0x5c;
    auVar16[0x1a] = 0x5c;
    auVar16[0x1b] = 0x5c;
    auVar16[0x1c] = 0x5c;
    auVar16[0x1d] = 0x5c;
    auVar16[0x1e] = 0x5c;
    auVar16[0x1f] = 0x5c;
    uVar9 = 0;
    auVar17[8] = 0x22;
    auVar17._0_8_ = 0x2222222222222222;
    auVar17[9] = 0x22;
    auVar17[10] = 0x22;
    auVar17[0xb] = 0x22;
    auVar17[0xc] = 0x22;
    auVar17[0xd] = 0x22;
    auVar17[0xe] = 0x22;
    auVar17[0xf] = 0x22;
    auVar17[0x10] = 0x22;
    auVar17[0x11] = 0x22;
    auVar17[0x12] = 0x22;
    auVar17[0x13] = 0x22;
    auVar17[0x14] = 0x22;
    auVar17[0x15] = 0x22;
    auVar17[0x16] = 0x22;
    auVar17[0x17] = 0x22;
    auVar17[0x18] = 0x22;
    auVar17[0x19] = 0x22;
    auVar17[0x1a] = 0x22;
    auVar17[0x1b] = 0x22;
    auVar17[0x1c] = 0x22;
    auVar17[0x1d] = 0x22;
    auVar17[0x1e] = 0x22;
    auVar17[0x1f] = 0x22;
    auVar3 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar22._16_16_ = _DAT_0018a110;
    auVar22._0_16_ = _DAT_0018a110;
    auVar25._8_4_ = 0xf7f7f7f;
    auVar25._0_8_ = 0xf7f7f7f0f7f7f7f;
    auVar25._12_4_ = 0xf7f7f7f;
    auVar25._16_4_ = 0xf7f7f7f;
    auVar25._20_4_ = 0xf7f7f7f;
    auVar25._24_4_ = 0xf7f7f7f;
    auVar25._28_4_ = 0xf7f7f7f;
    auVar26._16_16_ = _DAT_0018a120;
    auVar26._0_16_ = _DAT_0018a120;
    auVar27[8] = 0x18;
    auVar27._0_8_ = 0x1818181818181818;
    auVar27[9] = 0x18;
    auVar27[10] = 0x18;
    auVar27[0xb] = 0x18;
    auVar27[0xc] = 0x18;
    auVar27[0xd] = 0x18;
    auVar27[0xe] = 0x18;
    auVar27[0xf] = 0x18;
    auVar27[0x10] = 0x18;
    auVar27[0x11] = 0x18;
    auVar27[0x12] = 0x18;
    auVar27[0x13] = 0x18;
    auVar27[0x14] = 0x18;
    auVar27[0x15] = 0x18;
    auVar27[0x16] = 0x18;
    auVar27[0x17] = 0x18;
    auVar27[0x18] = 0x18;
    auVar27[0x19] = 0x18;
    auVar27[0x1a] = 0x18;
    auVar27[0x1b] = 0x18;
    auVar27[0x1c] = 0x18;
    auVar27[0x1d] = 0x18;
    auVar27[0x1e] = 0x18;
    auVar27[0x1f] = 0x18;
    uVar12 = 0;
    uVar13 = 0;
    for (; uVar9 < len - 0x3f; uVar9 = uVar9 + 0x40) {
      auVar1 = *(undefined1 (*) [32])(buf + uVar9);
      auVar2 = *(undefined1 (*) [32])(buf + uVar9 + 0x20);
      auVar29 = vpcmpeqb_avx2(auVar1,auVar16);
      auVar30 = vpcmpeqb_avx2(auVar2,auVar16);
      uVar11 = CONCAT44((uint)(SUB321(auVar30 >> 7,0) & 1) |
                        (uint)(SUB321(auVar30 >> 0xf,0) & 1) << 1 |
                        (uint)(SUB321(auVar30 >> 0x17,0) & 1) << 2 |
                        (uint)(SUB321(auVar30 >> 0x1f,0) & 1) << 3 |
                        (uint)(SUB321(auVar30 >> 0x27,0) & 1) << 4 |
                        (uint)(SUB321(auVar30 >> 0x2f,0) & 1) << 5 |
                        (uint)(SUB321(auVar30 >> 0x37,0) & 1) << 6 |
                        (uint)(SUB321(auVar30 >> 0x3f,0) & 1) << 7 |
                        (uint)(SUB321(auVar30 >> 0x47,0) & 1) << 8 |
                        (uint)(SUB321(auVar30 >> 0x4f,0) & 1) << 9 |
                        (uint)(SUB321(auVar30 >> 0x57,0) & 1) << 10 |
                        (uint)(SUB321(auVar30 >> 0x5f,0) & 1) << 0xb |
                        (uint)(SUB321(auVar30 >> 0x67,0) & 1) << 0xc |
                        (uint)(SUB321(auVar30 >> 0x6f,0) & 1) << 0xd |
                        (uint)(SUB321(auVar30 >> 0x77,0) & 1) << 0xe |
                        (uint)SUB321(auVar30 >> 0x7f,0) << 0xf |
                        (uint)(SUB321(auVar30 >> 0x87,0) & 1) << 0x10 |
                        (uint)(SUB321(auVar30 >> 0x8f,0) & 1) << 0x11 |
                        (uint)(SUB321(auVar30 >> 0x97,0) & 1) << 0x12 |
                        (uint)(SUB321(auVar30 >> 0x9f,0) & 1) << 0x13 |
                        (uint)(SUB321(auVar30 >> 0xa7,0) & 1) << 0x14 |
                        (uint)(SUB321(auVar30 >> 0xaf,0) & 1) << 0x15 |
                        (uint)(SUB321(auVar30 >> 0xb7,0) & 1) << 0x16 |
                        (uint)SUB321(auVar30 >> 0xbf,0) << 0x17 |
                        (uint)(SUB321(auVar30 >> 199,0) & 1) << 0x18 |
                        (uint)(SUB321(auVar30 >> 0xcf,0) & 1) << 0x19 |
                        (uint)(SUB321(auVar30 >> 0xd7,0) & 1) << 0x1a |
                        (uint)(SUB321(auVar30 >> 0xdf,0) & 1) << 0x1b |
                        (uint)(SUB321(auVar30 >> 0xe7,0) & 1) << 0x1c |
                        (uint)(SUB321(auVar30 >> 0xef,0) & 1) << 0x1d |
                        (uint)(SUB321(auVar30 >> 0xf7,0) & 1) << 0x1e |
                        (uint)(byte)(auVar30[0x1f] >> 7) << 0x1f,
                        (uint)(SUB321(auVar29 >> 7,0) & 1) |
                        (uint)(SUB321(auVar29 >> 0xf,0) & 1) << 1 |
                        (uint)(SUB321(auVar29 >> 0x17,0) & 1) << 2 |
                        (uint)(SUB321(auVar29 >> 0x1f,0) & 1) << 3 |
                        (uint)(SUB321(auVar29 >> 0x27,0) & 1) << 4 |
                        (uint)(SUB321(auVar29 >> 0x2f,0) & 1) << 5 |
                        (uint)(SUB321(auVar29 >> 0x37,0) & 1) << 6 |
                        (uint)(SUB321(auVar29 >> 0x3f,0) & 1) << 7 |
                        (uint)(SUB321(auVar29 >> 0x47,0) & 1) << 8 |
                        (uint)(SUB321(auVar29 >> 0x4f,0) & 1) << 9 |
                        (uint)(SUB321(auVar29 >> 0x57,0) & 1) << 10 |
                        (uint)(SUB321(auVar29 >> 0x5f,0) & 1) << 0xb |
                        (uint)(SUB321(auVar29 >> 0x67,0) & 1) << 0xc |
                        (uint)(SUB321(auVar29 >> 0x6f,0) & 1) << 0xd |
                        (uint)(SUB321(auVar29 >> 0x77,0) & 1) << 0xe |
                        (uint)SUB321(auVar29 >> 0x7f,0) << 0xf |
                        (uint)(SUB321(auVar29 >> 0x87,0) & 1) << 0x10 |
                        (uint)(SUB321(auVar29 >> 0x8f,0) & 1) << 0x11 |
                        (uint)(SUB321(auVar29 >> 0x97,0) & 1) << 0x12 |
                        (uint)(SUB321(auVar29 >> 0x9f,0) & 1) << 0x13 |
                        (uint)(SUB321(auVar29 >> 0xa7,0) & 1) << 0x14 |
                        (uint)(SUB321(auVar29 >> 0xaf,0) & 1) << 0x15 |
                        (uint)(SUB321(auVar29 >> 0xb7,0) & 1) << 0x16 |
                        (uint)SUB321(auVar29 >> 0xbf,0) << 0x17 |
                        (uint)(SUB321(auVar29 >> 199,0) & 1) << 0x18 |
                        (uint)(SUB321(auVar29 >> 0xcf,0) & 1) << 0x19 |
                        (uint)(SUB321(auVar29 >> 0xd7,0) & 1) << 0x1a |
                        (uint)(SUB321(auVar29 >> 0xdf,0) & 1) << 0x1b |
                        (uint)(SUB321(auVar29 >> 0xe7,0) & 1) << 0x1c |
                        (uint)(SUB321(auVar29 >> 0xef,0) & 1) << 0x1d |
                        (uint)(SUB321(auVar29 >> 0xf7,0) & 1) << 0x1e |
                        (uint)(byte)(auVar29[0x1f] >> 7) << 0x1f);
      uVar10 = ~(uVar11 * 2) & uVar11;
      uVar14 = (uVar13 | 0xaaaaaaaaaaaaaaaa) & uVar10;
      auVar29 = vpcmpeqb_avx2(auVar1,auVar17);
      auVar30 = vpcmpeqb_avx2(auVar2,auVar17);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = ~(~uVar11 & 0x5555555555555555 & (uVar14 + uVar11 | uVar13) |
                      ~uVar11 & 0xaaaaaaaaaaaaaaaa &
                      ((uVar13 ^ 0x5555555555555555) & uVar10) + uVar11) &
                     CONCAT44((uint)(SUB321(auVar30 >> 7,0) & 1) |
                              (uint)(SUB321(auVar30 >> 0xf,0) & 1) << 1 |
                              (uint)(SUB321(auVar30 >> 0x17,0) & 1) << 2 |
                              (uint)(SUB321(auVar30 >> 0x1f,0) & 1) << 3 |
                              (uint)(SUB321(auVar30 >> 0x27,0) & 1) << 4 |
                              (uint)(SUB321(auVar30 >> 0x2f,0) & 1) << 5 |
                              (uint)(SUB321(auVar30 >> 0x37,0) & 1) << 6 |
                              (uint)(SUB321(auVar30 >> 0x3f,0) & 1) << 7 |
                              (uint)(SUB321(auVar30 >> 0x47,0) & 1) << 8 |
                              (uint)(SUB321(auVar30 >> 0x4f,0) & 1) << 9 |
                              (uint)(SUB321(auVar30 >> 0x57,0) & 1) << 10 |
                              (uint)(SUB321(auVar30 >> 0x5f,0) & 1) << 0xb |
                              (uint)(SUB321(auVar30 >> 0x67,0) & 1) << 0xc |
                              (uint)(SUB321(auVar30 >> 0x6f,0) & 1) << 0xd |
                              (uint)(SUB321(auVar30 >> 0x77,0) & 1) << 0xe |
                              (uint)SUB321(auVar30 >> 0x7f,0) << 0xf |
                              (uint)(SUB321(auVar30 >> 0x87,0) & 1) << 0x10 |
                              (uint)(SUB321(auVar30 >> 0x8f,0) & 1) << 0x11 |
                              (uint)(SUB321(auVar30 >> 0x97,0) & 1) << 0x12 |
                              (uint)(SUB321(auVar30 >> 0x9f,0) & 1) << 0x13 |
                              (uint)(SUB321(auVar30 >> 0xa7,0) & 1) << 0x14 |
                              (uint)(SUB321(auVar30 >> 0xaf,0) & 1) << 0x15 |
                              (uint)(SUB321(auVar30 >> 0xb7,0) & 1) << 0x16 |
                              (uint)SUB321(auVar30 >> 0xbf,0) << 0x17 |
                              (uint)(SUB321(auVar30 >> 199,0) & 1) << 0x18 |
                              (uint)(SUB321(auVar30 >> 0xcf,0) & 1) << 0x19 |
                              (uint)(SUB321(auVar30 >> 0xd7,0) & 1) << 0x1a |
                              (uint)(SUB321(auVar30 >> 0xdf,0) & 1) << 0x1b |
                              (uint)(SUB321(auVar30 >> 0xe7,0) & 1) << 0x1c |
                              (uint)(SUB321(auVar30 >> 0xef,0) & 1) << 0x1d |
                              (uint)(SUB321(auVar30 >> 0xf7,0) & 1) << 0x1e |
                              (uint)(byte)(auVar30[0x1f] >> 7) << 0x1f,
                              (uint)(SUB321(auVar29 >> 7,0) & 1) |
                              (uint)(SUB321(auVar29 >> 0xf,0) & 1) << 1 |
                              (uint)(SUB321(auVar29 >> 0x17,0) & 1) << 2 |
                              (uint)(SUB321(auVar29 >> 0x1f,0) & 1) << 3 |
                              (uint)(SUB321(auVar29 >> 0x27,0) & 1) << 4 |
                              (uint)(SUB321(auVar29 >> 0x2f,0) & 1) << 5 |
                              (uint)(SUB321(auVar29 >> 0x37,0) & 1) << 6 |
                              (uint)(SUB321(auVar29 >> 0x3f,0) & 1) << 7 |
                              (uint)(SUB321(auVar29 >> 0x47,0) & 1) << 8 |
                              (uint)(SUB321(auVar29 >> 0x4f,0) & 1) << 9 |
                              (uint)(SUB321(auVar29 >> 0x57,0) & 1) << 10 |
                              (uint)(SUB321(auVar29 >> 0x5f,0) & 1) << 0xb |
                              (uint)(SUB321(auVar29 >> 0x67,0) & 1) << 0xc |
                              (uint)(SUB321(auVar29 >> 0x6f,0) & 1) << 0xd |
                              (uint)(SUB321(auVar29 >> 0x77,0) & 1) << 0xe |
                              (uint)SUB321(auVar29 >> 0x7f,0) << 0xf |
                              (uint)(SUB321(auVar29 >> 0x87,0) & 1) << 0x10 |
                              (uint)(SUB321(auVar29 >> 0x8f,0) & 1) << 0x11 |
                              (uint)(SUB321(auVar29 >> 0x97,0) & 1) << 0x12 |
                              (uint)(SUB321(auVar29 >> 0x9f,0) & 1) << 0x13 |
                              (uint)(SUB321(auVar29 >> 0xa7,0) & 1) << 0x14 |
                              (uint)(SUB321(auVar29 >> 0xaf,0) & 1) << 0x15 |
                              (uint)(SUB321(auVar29 >> 0xb7,0) & 1) << 0x16 |
                              (uint)SUB321(auVar29 >> 0xbf,0) << 0x17 |
                              (uint)(SUB321(auVar29 >> 199,0) & 1) << 0x18 |
                              (uint)(SUB321(auVar29 >> 0xcf,0) & 1) << 0x19 |
                              (uint)(SUB321(auVar29 >> 0xd7,0) & 1) << 0x1a |
                              (uint)(SUB321(auVar29 >> 0xdf,0) & 1) << 0x1b |
                              (uint)(SUB321(auVar29 >> 0xe7,0) & 1) << 0x1c |
                              (uint)(SUB321(auVar29 >> 0xef,0) & 1) << 0x1d |
                              (uint)(SUB321(auVar29 >> 0xf7,0) & 1) << 0x1e |
                              (uint)(byte)(auVar29[0x1f] >> 7) << 0x1f);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = auVar3._0_8_;
      auVar5 = (undefined1  [16])0x0;
      for (uVar4 = 0; uVar4 < 0x40; uVar4 = uVar4 + 1) {
        if ((auVar6 & (undefined1  [16])0x1 << uVar4) != (undefined1  [16])0x0) {
          auVar5 = auVar5 ^ auVar7 << uVar4;
        }
      }
      uVar12 = auVar5._0_8_ ^ uVar12;
      auVar30 = vpshufb_avx2(auVar22,auVar1);
      auVar29 = vpsrld_avx2(auVar1,4);
      auVar29 = vpand_avx2(auVar29,auVar25);
      auVar18 = vpshufb_avx2(auVar26,auVar29);
      auVar19 = vpshufb_avx2(auVar22,auVar2);
      auVar29 = vpsrld_avx2(auVar2,4);
      auVar29 = vpand_avx2(auVar29,auVar25);
      auVar20 = vpshufb_avx2(auVar26,auVar29);
      auVar29 = vpand_avx2(auVar30,auVar27);
      auVar29 = vpand_avx2(auVar29,auVar18);
      auVar30 = vpand_avx2(auVar19,auVar27);
      auVar30 = vpand_avx2(auVar30,auVar20);
      auVar29 = vpcmpeqb_avx2(auVar29,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar30 = vpcmpeqb_avx2(auVar30,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      uVar13 = CONCAT44((uint)(SUB321(auVar30 >> 7,0) & 1) |
                        (uint)(SUB321(auVar30 >> 0xf,0) & 1) << 1 |
                        (uint)(SUB321(auVar30 >> 0x17,0) & 1) << 2 |
                        (uint)(SUB321(auVar30 >> 0x1f,0) & 1) << 3 |
                        (uint)(SUB321(auVar30 >> 0x27,0) & 1) << 4 |
                        (uint)(SUB321(auVar30 >> 0x2f,0) & 1) << 5 |
                        (uint)(SUB321(auVar30 >> 0x37,0) & 1) << 6 |
                        (uint)(SUB321(auVar30 >> 0x3f,0) & 1) << 7 |
                        (uint)(SUB321(auVar30 >> 0x47,0) & 1) << 8 |
                        (uint)(SUB321(auVar30 >> 0x4f,0) & 1) << 9 |
                        (uint)(SUB321(auVar30 >> 0x57,0) & 1) << 10 |
                        (uint)(SUB321(auVar30 >> 0x5f,0) & 1) << 0xb |
                        (uint)(SUB321(auVar30 >> 0x67,0) & 1) << 0xc |
                        (uint)(SUB321(auVar30 >> 0x6f,0) & 1) << 0xd |
                        (uint)(SUB321(auVar30 >> 0x77,0) & 1) << 0xe |
                        (uint)SUB321(auVar30 >> 0x7f,0) << 0xf |
                        (uint)(SUB321(auVar30 >> 0x87,0) & 1) << 0x10 |
                        (uint)(SUB321(auVar30 >> 0x8f,0) & 1) << 0x11 |
                        (uint)(SUB321(auVar30 >> 0x97,0) & 1) << 0x12 |
                        (uint)(SUB321(auVar30 >> 0x9f,0) & 1) << 0x13 |
                        (uint)(SUB321(auVar30 >> 0xa7,0) & 1) << 0x14 |
                        (uint)(SUB321(auVar30 >> 0xaf,0) & 1) << 0x15 |
                        (uint)(SUB321(auVar30 >> 0xb7,0) & 1) << 0x16 |
                        (uint)SUB321(auVar30 >> 0xbf,0) << 0x17 |
                        (uint)(SUB321(auVar30 >> 199,0) & 1) << 0x18 |
                        (uint)(SUB321(auVar30 >> 0xcf,0) & 1) << 0x19 |
                        (uint)(SUB321(auVar30 >> 0xd7,0) & 1) << 0x1a |
                        (uint)(SUB321(auVar30 >> 0xdf,0) & 1) << 0x1b |
                        (uint)(SUB321(auVar30 >> 0xe7,0) & 1) << 0x1c |
                        (uint)(SUB321(auVar30 >> 0xef,0) & 1) << 0x1d |
                        (uint)(SUB321(auVar30 >> 0xf7,0) & 1) << 0x1e |
                        (uint)(byte)(auVar30[0x1f] >> 7) << 0x1f,
                        (uint)(SUB321(auVar29 >> 7,0) & 1) |
                        (uint)(SUB321(auVar29 >> 0xf,0) & 1) << 1 |
                        (uint)(SUB321(auVar29 >> 0x17,0) & 1) << 2 |
                        (uint)(SUB321(auVar29 >> 0x1f,0) & 1) << 3 |
                        (uint)(SUB321(auVar29 >> 0x27,0) & 1) << 4 |
                        (uint)(SUB321(auVar29 >> 0x2f,0) & 1) << 5 |
                        (uint)(SUB321(auVar29 >> 0x37,0) & 1) << 6 |
                        (uint)(SUB321(auVar29 >> 0x3f,0) & 1) << 7 |
                        (uint)(SUB321(auVar29 >> 0x47,0) & 1) << 8 |
                        (uint)(SUB321(auVar29 >> 0x4f,0) & 1) << 9 |
                        (uint)(SUB321(auVar29 >> 0x57,0) & 1) << 10 |
                        (uint)(SUB321(auVar29 >> 0x5f,0) & 1) << 0xb |
                        (uint)(SUB321(auVar29 >> 0x67,0) & 1) << 0xc |
                        (uint)(SUB321(auVar29 >> 0x6f,0) & 1) << 0xd |
                        (uint)(SUB321(auVar29 >> 0x77,0) & 1) << 0xe |
                        (uint)SUB321(auVar29 >> 0x7f,0) << 0xf |
                        (uint)(SUB321(auVar29 >> 0x87,0) & 1) << 0x10 |
                        (uint)(SUB321(auVar29 >> 0x8f,0) & 1) << 0x11 |
                        (uint)(SUB321(auVar29 >> 0x97,0) & 1) << 0x12 |
                        (uint)(SUB321(auVar29 >> 0x9f,0) & 1) << 0x13 |
                        (uint)(SUB321(auVar29 >> 0xa7,0) & 1) << 0x14 |
                        (uint)(SUB321(auVar29 >> 0xaf,0) & 1) << 0x15 |
                        (uint)(SUB321(auVar29 >> 0xb7,0) & 1) << 0x16 |
                        (uint)SUB321(auVar29 >> 0xbf,0) << 0x17 |
                        (uint)(SUB321(auVar29 >> 199,0) & 1) << 0x18 |
                        (uint)(SUB321(auVar29 >> 0xcf,0) & 1) << 0x19 |
                        (uint)(SUB321(auVar29 >> 0xd7,0) & 1) << 0x1a |
                        (uint)(SUB321(auVar29 >> 0xdf,0) & 1) << 0x1b |
                        (uint)(SUB321(auVar29 >> 0xe7,0) & 1) << 0x1c |
                        (uint)(SUB321(auVar29 >> 0xef,0) & 1) << 0x1d |
                        (uint)(SUB321(auVar29 >> 0xf7,0) & 1) << 0x1e |
                        (uint)(byte)(auVar29[0x1f] >> 7) << 0x1f) | uVar12;
      uVar10 = ~uVar13;
      auVar29._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])("" + ((uint)(uVar10 >> 0xc) & 0x7fff0)) +
           ZEXT116(1) * *(undefined1 (*) [16])("" + (((uint)uVar10 & 0x7fff) << 4));
      auVar29._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])("" + ((uint)(uVar10 >> 0xc) & 0x7fff0));
      auVar30._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])("" + (((ushort)(uVar10 >> 0x30) & 0x7fff) << 4)) +
           ZEXT116(1) * *(undefined1 (*) [16])("" + (((uint)(uVar10 >> 0x20) & 0x7fff) << 4));
      auVar30._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])("" + (((ushort)(uVar10 >> 0x30) & 0x7fff) << 4));
      auVar1 = vpshufb_avx2(auVar1,auVar29);
      *pauVar15 = auVar1._0_16_;
      *(undefined1 (*) [16])(*pauVar15 + (uint)POPCOUNT((uint)uVar13 & 0xffff)) = auVar1._16_16_;
      auVar1 = vpshufb_avx2(auVar2,auVar30);
      *(undefined1 (*) [16])(*pauVar15 + (uint)POPCOUNT((uint)uVar13)) = auVar1._0_16_;
      *(undefined1 (*) [16])(*pauVar15 + POPCOUNT(uVar13 & 0xffffffffffff)) = auVar1._16_16_;
      pauVar15 = (undefined1 (*) [16])(*pauVar15 + POPCOUNT(uVar13));
      uVar12 = (long)uVar12 >> 0x3f;
      uVar13 = (ulong)CARRY8(uVar14,uVar11);
    }
  }
  uVar10 = len - uVar9;
  if (uVar9 <= len && uVar10 != 0) {
    buffer[0x20] = '\0';
    buffer[0x21] = '\0';
    buffer[0x22] = '\0';
    buffer[0x23] = '\0';
    buffer[0x24] = '\0';
    buffer[0x25] = '\0';
    buffer[0x26] = '\0';
    buffer[0x27] = '\0';
    buffer[0x28] = '\0';
    buffer[0x29] = '\0';
    buffer[0x2a] = '\0';
    buffer[0x2b] = '\0';
    buffer[0x2c] = '\0';
    buffer[0x2d] = '\0';
    buffer[0x2e] = '\0';
    buffer[0x2f] = '\0';
    buffer[0x30] = '\0';
    buffer[0x31] = '\0';
    buffer[0x32] = '\0';
    buffer[0x33] = '\0';
    buffer[0x34] = '\0';
    buffer[0x35] = '\0';
    buffer[0x36] = '\0';
    buffer[0x37] = '\0';
    buffer[0x38] = '\0';
    buffer[0x39] = '\0';
    buffer[0x3a] = '\0';
    buffer[0x3b] = '\0';
    buffer[0x3c] = '\0';
    buffer[0x3d] = '\0';
    buffer[0x3e] = '\0';
    buffer[0x3f] = '\0';
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    buffer[0x18] = '\0';
    buffer[0x19] = '\0';
    buffer[0x1a] = '\0';
    buffer[0x1b] = '\0';
    buffer[0x1c] = '\0';
    buffer[0x1d] = '\0';
    buffer[0x1e] = '\0';
    buffer[0x1f] = '\0';
    memcpy(buffer,buf + uVar9,uVar10);
    auVar1[8] = buffer[8];
    auVar1[9] = buffer[9];
    auVar1[10] = buffer[10];
    auVar1[0xb] = buffer[0xb];
    auVar1[0xc] = buffer[0xc];
    auVar1[0xd] = buffer[0xd];
    auVar1[0xe] = buffer[0xe];
    auVar1[0xf] = buffer[0xf];
    auVar1[0] = buffer[0];
    auVar1[1] = buffer[1];
    auVar1[2] = buffer[2];
    auVar1[3] = buffer[3];
    auVar1[4] = buffer[4];
    auVar1[5] = buffer[5];
    auVar1[6] = buffer[6];
    auVar1[7] = buffer[7];
    auVar1[0x10] = buffer[0x10];
    auVar1[0x11] = buffer[0x11];
    auVar1[0x12] = buffer[0x12];
    auVar1[0x13] = buffer[0x13];
    auVar1[0x14] = buffer[0x14];
    auVar1[0x15] = buffer[0x15];
    auVar1[0x16] = buffer[0x16];
    auVar1[0x17] = buffer[0x17];
    auVar1[0x18] = buffer[0x18];
    auVar1[0x19] = buffer[0x19];
    auVar1[0x1a] = buffer[0x1a];
    auVar1[0x1b] = buffer[0x1b];
    auVar1[0x1c] = buffer[0x1c];
    auVar1[0x1d] = buffer[0x1d];
    auVar1[0x1e] = buffer[0x1e];
    auVar1[0x1f] = buffer[0x1f];
    auVar2[8] = buffer[0x28];
    auVar2[9] = buffer[0x29];
    auVar2[10] = buffer[0x2a];
    auVar2[0xb] = buffer[0x2b];
    auVar2[0xc] = buffer[0x2c];
    auVar2[0xd] = buffer[0x2d];
    auVar2[0xe] = buffer[0x2e];
    auVar2[0xf] = buffer[0x2f];
    auVar2[0] = buffer[0x20];
    auVar2[1] = buffer[0x21];
    auVar2[2] = buffer[0x22];
    auVar2[3] = buffer[0x23];
    auVar2[4] = buffer[0x24];
    auVar2[5] = buffer[0x25];
    auVar2[6] = buffer[0x26];
    auVar2[7] = buffer[0x27];
    auVar2[0x10] = buffer[0x30];
    auVar2[0x11] = buffer[0x31];
    auVar2[0x12] = buffer[0x32];
    auVar2[0x13] = buffer[0x33];
    auVar2[0x14] = buffer[0x34];
    auVar2[0x15] = buffer[0x35];
    auVar2[0x16] = buffer[0x36];
    auVar2[0x17] = buffer[0x37];
    auVar2[0x18] = buffer[0x38];
    auVar2[0x19] = buffer[0x39];
    auVar2[0x1a] = buffer[0x3a];
    auVar2[0x1b] = buffer[0x3b];
    auVar2[0x1c] = buffer[0x3c];
    auVar2[0x1d] = buffer[0x3d];
    auVar2[0x1e] = buffer[0x3e];
    auVar2[0x1f] = buffer[0x3f];
    auVar18[8] = 0x5c;
    auVar18._0_8_ = 0x5c5c5c5c5c5c5c5c;
    auVar18[9] = 0x5c;
    auVar18[10] = 0x5c;
    auVar18[0xb] = 0x5c;
    auVar18[0xc] = 0x5c;
    auVar18[0xd] = 0x5c;
    auVar18[0xe] = 0x5c;
    auVar18[0xf] = 0x5c;
    auVar18[0x10] = 0x5c;
    auVar18[0x11] = 0x5c;
    auVar18[0x12] = 0x5c;
    auVar18[0x13] = 0x5c;
    auVar18[0x14] = 0x5c;
    auVar18[0x15] = 0x5c;
    auVar18[0x16] = 0x5c;
    auVar18[0x17] = 0x5c;
    auVar18[0x18] = 0x5c;
    auVar18[0x19] = 0x5c;
    auVar18[0x1a] = 0x5c;
    auVar18[0x1b] = 0x5c;
    auVar18[0x1c] = 0x5c;
    auVar18[0x1d] = 0x5c;
    auVar18[0x1e] = 0x5c;
    auVar18[0x1f] = 0x5c;
    auVar16 = vpcmpeqb_avx2(auVar1,auVar18);
    auVar17 = vpcmpeqb_avx2(auVar2,auVar18);
    uVar11 = CONCAT44((uint)(SUB321(auVar17 >> 7,0) & 1) | (uint)(SUB321(auVar17 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar17 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar17 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar17 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar17 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar17 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar17 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar17 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar17 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar17 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar17 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar17 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar17 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar17 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar17 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar17 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar17 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar17 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar17 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar17 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar17 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar17 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar17 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar17 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar17 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar17 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar17 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar17 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar17 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar17 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar17[0x1f] >> 7) << 0x1f,
                      (uint)(SUB321(auVar16 >> 7,0) & 1) | (uint)(SUB321(auVar16 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar16 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar16 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar16 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar16 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar16 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar16 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar16 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar16 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar16 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar16 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar16 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar16 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar16 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar16 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar16 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar16 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar16 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar16 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar16 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar16 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar16 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar16 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar16 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar16 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar16 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar16 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar16 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar16 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar16 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar16[0x1f] >> 7) << 0x1f);
    uVar9 = ~(uVar11 * 2) & uVar11;
    auVar19[8] = 0x22;
    auVar19._0_8_ = 0x2222222222222222;
    auVar19[9] = 0x22;
    auVar19[10] = 0x22;
    auVar19[0xb] = 0x22;
    auVar19[0xc] = 0x22;
    auVar19[0xd] = 0x22;
    auVar19[0xe] = 0x22;
    auVar19[0xf] = 0x22;
    auVar19[0x10] = 0x22;
    auVar19[0x11] = 0x22;
    auVar19[0x12] = 0x22;
    auVar19[0x13] = 0x22;
    auVar19[0x14] = 0x22;
    auVar19[0x15] = 0x22;
    auVar19[0x16] = 0x22;
    auVar19[0x17] = 0x22;
    auVar19[0x18] = 0x22;
    auVar19[0x19] = 0x22;
    auVar19[0x1a] = 0x22;
    auVar19[0x1b] = 0x22;
    auVar19[0x1c] = 0x22;
    auVar19[0x1d] = 0x22;
    auVar19[0x1e] = 0x22;
    auVar19[0x1f] = 0x22;
    auVar16 = vpcmpeqb_avx2(auVar1,auVar19);
    auVar17 = vpcmpeqb_avx2(auVar2,auVar19);
    auVar3 = vpcmpeqd_avx(auVar16._0_16_,auVar16._0_16_);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = ~(~uVar11 & 0x5555555555555555 &
                     (((uVar13 ^ 0x2aaaaaaaaaaaaaaa) & uVar9) + uVar11 | uVar13) |
                    ~uVar11 & 0xaaaaaaaaaaaaaaaa & ((uVar13 ^ 0x5555555555555555) & uVar9) + uVar11)
                   & CONCAT44((uint)(SUB321(auVar17 >> 7,0) & 1) |
                              (uint)(SUB321(auVar17 >> 0xf,0) & 1) << 1 |
                              (uint)(SUB321(auVar17 >> 0x17,0) & 1) << 2 |
                              (uint)(SUB321(auVar17 >> 0x1f,0) & 1) << 3 |
                              (uint)(SUB321(auVar17 >> 0x27,0) & 1) << 4 |
                              (uint)(SUB321(auVar17 >> 0x2f,0) & 1) << 5 |
                              (uint)(SUB321(auVar17 >> 0x37,0) & 1) << 6 |
                              (uint)(SUB321(auVar17 >> 0x3f,0) & 1) << 7 |
                              (uint)(SUB321(auVar17 >> 0x47,0) & 1) << 8 |
                              (uint)(SUB321(auVar17 >> 0x4f,0) & 1) << 9 |
                              (uint)(SUB321(auVar17 >> 0x57,0) & 1) << 10 |
                              (uint)(SUB321(auVar17 >> 0x5f,0) & 1) << 0xb |
                              (uint)(SUB321(auVar17 >> 0x67,0) & 1) << 0xc |
                              (uint)(SUB321(auVar17 >> 0x6f,0) & 1) << 0xd |
                              (uint)(SUB321(auVar17 >> 0x77,0) & 1) << 0xe |
                              (uint)SUB321(auVar17 >> 0x7f,0) << 0xf |
                              (uint)(SUB321(auVar17 >> 0x87,0) & 1) << 0x10 |
                              (uint)(SUB321(auVar17 >> 0x8f,0) & 1) << 0x11 |
                              (uint)(SUB321(auVar17 >> 0x97,0) & 1) << 0x12 |
                              (uint)(SUB321(auVar17 >> 0x9f,0) & 1) << 0x13 |
                              (uint)(SUB321(auVar17 >> 0xa7,0) & 1) << 0x14 |
                              (uint)(SUB321(auVar17 >> 0xaf,0) & 1) << 0x15 |
                              (uint)(SUB321(auVar17 >> 0xb7,0) & 1) << 0x16 |
                              (uint)SUB321(auVar17 >> 0xbf,0) << 0x17 |
                              (uint)(SUB321(auVar17 >> 199,0) & 1) << 0x18 |
                              (uint)(SUB321(auVar17 >> 0xcf,0) & 1) << 0x19 |
                              (uint)(SUB321(auVar17 >> 0xd7,0) & 1) << 0x1a |
                              (uint)(SUB321(auVar17 >> 0xdf,0) & 1) << 0x1b |
                              (uint)(SUB321(auVar17 >> 0xe7,0) & 1) << 0x1c |
                              (uint)(SUB321(auVar17 >> 0xef,0) & 1) << 0x1d |
                              (uint)(SUB321(auVar17 >> 0xf7,0) & 1) << 0x1e |
                              (uint)(byte)(auVar17[0x1f] >> 7) << 0x1f,
                              (uint)(SUB321(auVar16 >> 7,0) & 1) |
                              (uint)(SUB321(auVar16 >> 0xf,0) & 1) << 1 |
                              (uint)(SUB321(auVar16 >> 0x17,0) & 1) << 2 |
                              (uint)(SUB321(auVar16 >> 0x1f,0) & 1) << 3 |
                              (uint)(SUB321(auVar16 >> 0x27,0) & 1) << 4 |
                              (uint)(SUB321(auVar16 >> 0x2f,0) & 1) << 5 |
                              (uint)(SUB321(auVar16 >> 0x37,0) & 1) << 6 |
                              (uint)(SUB321(auVar16 >> 0x3f,0) & 1) << 7 |
                              (uint)(SUB321(auVar16 >> 0x47,0) & 1) << 8 |
                              (uint)(SUB321(auVar16 >> 0x4f,0) & 1) << 9 |
                              (uint)(SUB321(auVar16 >> 0x57,0) & 1) << 10 |
                              (uint)(SUB321(auVar16 >> 0x5f,0) & 1) << 0xb |
                              (uint)(SUB321(auVar16 >> 0x67,0) & 1) << 0xc |
                              (uint)(SUB321(auVar16 >> 0x6f,0) & 1) << 0xd |
                              (uint)(SUB321(auVar16 >> 0x77,0) & 1) << 0xe |
                              (uint)SUB321(auVar16 >> 0x7f,0) << 0xf |
                              (uint)(SUB321(auVar16 >> 0x87,0) & 1) << 0x10 |
                              (uint)(SUB321(auVar16 >> 0x8f,0) & 1) << 0x11 |
                              (uint)(SUB321(auVar16 >> 0x97,0) & 1) << 0x12 |
                              (uint)(SUB321(auVar16 >> 0x9f,0) & 1) << 0x13 |
                              (uint)(SUB321(auVar16 >> 0xa7,0) & 1) << 0x14 |
                              (uint)(SUB321(auVar16 >> 0xaf,0) & 1) << 0x15 |
                              (uint)(SUB321(auVar16 >> 0xb7,0) & 1) << 0x16 |
                              (uint)SUB321(auVar16 >> 0xbf,0) << 0x17 |
                              (uint)(SUB321(auVar16 >> 199,0) & 1) << 0x18 |
                              (uint)(SUB321(auVar16 >> 0xcf,0) & 1) << 0x19 |
                              (uint)(SUB321(auVar16 >> 0xd7,0) & 1) << 0x1a |
                              (uint)(SUB321(auVar16 >> 0xdf,0) & 1) << 0x1b |
                              (uint)(SUB321(auVar16 >> 0xe7,0) & 1) << 0x1c |
                              (uint)(SUB321(auVar16 >> 0xef,0) & 1) << 0x1d |
                              (uint)(SUB321(auVar16 >> 0xf7,0) & 1) << 0x1e |
                              (uint)(byte)(auVar16[0x1f] >> 7) << 0x1f);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = auVar3._0_8_;
    auVar3 = (undefined1  [16])0x0;
    for (uVar4 = 0; uVar4 < 0x40; uVar4 = uVar4 + 1) {
      if ((auVar5 & (undefined1  [16])0x1 << uVar4) != (undefined1  [16])0x0) {
        auVar3 = auVar3 ^ auVar8 << uVar4;
      }
    }
    auVar20[8] = 0x20;
    auVar20._0_8_ = 0x2020202020202020;
    auVar20[9] = 0x20;
    auVar20[10] = 0x20;
    auVar20[0xb] = 0x20;
    auVar20[0xc] = 0x20;
    auVar20[0xd] = 0x20;
    auVar20[0xe] = 0x20;
    auVar20[0xf] = 0x20;
    auVar20[0x10] = 0x20;
    auVar20[0x11] = 0x20;
    auVar20[0x12] = 0x20;
    auVar20[0x13] = 0x20;
    auVar20[0x14] = 0x20;
    auVar20[0x15] = 0x20;
    auVar20[0x16] = 0x20;
    auVar20[0x17] = 0x20;
    auVar20[0x18] = 0x20;
    auVar20[0x19] = 0x20;
    auVar20[0x1a] = 0x20;
    auVar20[0x1b] = 0x20;
    auVar20[0x1c] = 0x20;
    auVar20[0x1d] = 0x20;
    auVar20[0x1e] = 0x20;
    auVar20[0x1f] = 0x20;
    auVar23[8] = 0x70;
    auVar23._0_8_ = 0x7070707070707070;
    auVar23[9] = 0x70;
    auVar23[10] = 0x70;
    auVar23[0xb] = 0x70;
    auVar23[0xc] = 0x70;
    auVar23[0xd] = 0x70;
    auVar23[0xe] = 0x70;
    auVar23[0xf] = 0x70;
    auVar23[0x10] = 0x70;
    auVar23[0x11] = 0x70;
    auVar23[0x12] = 0x70;
    auVar23[0x13] = 0x70;
    auVar23[0x14] = 0x70;
    auVar23[0x15] = 0x70;
    auVar23[0x16] = 0x70;
    auVar23[0x17] = 0x70;
    auVar23[0x18] = 0x70;
    auVar23[0x19] = 0x70;
    auVar23[0x1a] = 0x70;
    auVar23[0x1b] = 0x70;
    auVar23[0x1c] = 0x70;
    auVar23[0x1d] = 0x70;
    auVar23[0x1e] = 0x70;
    auVar23[0x1f] = 0x70;
    auVar17 = vpcmpeqb_avx2(auVar1,auVar20);
    auVar16 = vpaddusb_avx2(auVar1,auVar23);
    auVar28._16_16_ = _DAT_0018a130;
    auVar28._0_16_ = _DAT_0018a130;
    auVar16 = vpshufb_avx2(auVar28,auVar16);
    auVar22 = vpor_avx2(auVar17,auVar16);
    auVar17 = vpcmpeqb_avx2(auVar2,auVar20);
    auVar16 = vpaddusb_avx2(auVar2,auVar23);
    auVar16 = vpshufb_avx2(auVar28,auVar16);
    auVar16 = vpor_avx2(auVar17,auVar16);
    uVar13 = 0;
    if (uVar10 < 0x40) {
      uVar13 = -1L << (uVar10 & 0x3f);
    }
    uVar13 = uVar13 | ~(uVar12 ^ auVar3._0_8_) &
                      CONCAT44((uint)(SUB321(auVar16 >> 7,0) & 1) |
                               (uint)(SUB321(auVar16 >> 0xf,0) & 1) << 1 |
                               (uint)(SUB321(auVar16 >> 0x17,0) & 1) << 2 |
                               (uint)(SUB321(auVar16 >> 0x1f,0) & 1) << 3 |
                               (uint)(SUB321(auVar16 >> 0x27,0) & 1) << 4 |
                               (uint)(SUB321(auVar16 >> 0x2f,0) & 1) << 5 |
                               (uint)(SUB321(auVar16 >> 0x37,0) & 1) << 6 |
                               (uint)(SUB321(auVar16 >> 0x3f,0) & 1) << 7 |
                               (uint)(SUB321(auVar16 >> 0x47,0) & 1) << 8 |
                               (uint)(SUB321(auVar16 >> 0x4f,0) & 1) << 9 |
                               (uint)(SUB321(auVar16 >> 0x57,0) & 1) << 10 |
                               (uint)(SUB321(auVar16 >> 0x5f,0) & 1) << 0xb |
                               (uint)(SUB321(auVar16 >> 0x67,0) & 1) << 0xc |
                               (uint)(SUB321(auVar16 >> 0x6f,0) & 1) << 0xd |
                               (uint)(SUB321(auVar16 >> 0x77,0) & 1) << 0xe |
                               (uint)SUB321(auVar16 >> 0x7f,0) << 0xf |
                               (uint)(SUB321(auVar16 >> 0x87,0) & 1) << 0x10 |
                               (uint)(SUB321(auVar16 >> 0x8f,0) & 1) << 0x11 |
                               (uint)(SUB321(auVar16 >> 0x97,0) & 1) << 0x12 |
                               (uint)(SUB321(auVar16 >> 0x9f,0) & 1) << 0x13 |
                               (uint)(SUB321(auVar16 >> 0xa7,0) & 1) << 0x14 |
                               (uint)(SUB321(auVar16 >> 0xaf,0) & 1) << 0x15 |
                               (uint)(SUB321(auVar16 >> 0xb7,0) & 1) << 0x16 |
                               (uint)SUB321(auVar16 >> 0xbf,0) << 0x17 |
                               (uint)(SUB321(auVar16 >> 199,0) & 1) << 0x18 |
                               (uint)(SUB321(auVar16 >> 0xcf,0) & 1) << 0x19 |
                               (uint)(SUB321(auVar16 >> 0xd7,0) & 1) << 0x1a |
                               (uint)(SUB321(auVar16 >> 0xdf,0) & 1) << 0x1b |
                               (uint)(SUB321(auVar16 >> 0xe7,0) & 1) << 0x1c |
                               (uint)(SUB321(auVar16 >> 0xef,0) & 1) << 0x1d |
                               (uint)(SUB321(auVar16 >> 0xf7,0) & 1) << 0x1e |
                               (uint)(byte)(auVar16[0x1f] >> 7) << 0x1f,
                               (uint)(SUB321(auVar22 >> 7,0) & 1) |
                               (uint)(SUB321(auVar22 >> 0xf,0) & 1) << 1 |
                               (uint)(SUB321(auVar22 >> 0x17,0) & 1) << 2 |
                               (uint)(SUB321(auVar22 >> 0x1f,0) & 1) << 3 |
                               (uint)(SUB321(auVar22 >> 0x27,0) & 1) << 4 |
                               (uint)(SUB321(auVar22 >> 0x2f,0) & 1) << 5 |
                               (uint)(SUB321(auVar22 >> 0x37,0) & 1) << 6 |
                               (uint)(SUB321(auVar22 >> 0x3f,0) & 1) << 7 |
                               (uint)(SUB321(auVar22 >> 0x47,0) & 1) << 8 |
                               (uint)(SUB321(auVar22 >> 0x4f,0) & 1) << 9 |
                               (uint)(SUB321(auVar22 >> 0x57,0) & 1) << 10 |
                               (uint)(SUB321(auVar22 >> 0x5f,0) & 1) << 0xb |
                               (uint)(SUB321(auVar22 >> 0x67,0) & 1) << 0xc |
                               (uint)(SUB321(auVar22 >> 0x6f,0) & 1) << 0xd |
                               (uint)(SUB321(auVar22 >> 0x77,0) & 1) << 0xe |
                               (uint)SUB321(auVar22 >> 0x7f,0) << 0xf |
                               (uint)(SUB321(auVar22 >> 0x87,0) & 1) << 0x10 |
                               (uint)(SUB321(auVar22 >> 0x8f,0) & 1) << 0x11 |
                               (uint)(SUB321(auVar22 >> 0x97,0) & 1) << 0x12 |
                               (uint)(SUB321(auVar22 >> 0x9f,0) & 1) << 0x13 |
                               (uint)(SUB321(auVar22 >> 0xa7,0) & 1) << 0x14 |
                               (uint)(SUB321(auVar22 >> 0xaf,0) & 1) << 0x15 |
                               (uint)(SUB321(auVar22 >> 0xb7,0) & 1) << 0x16 |
                               (uint)SUB321(auVar22 >> 0xbf,0) << 0x17 |
                               (uint)(SUB321(auVar22 >> 199,0) & 1) << 0x18 |
                               (uint)(SUB321(auVar22 >> 0xcf,0) & 1) << 0x19 |
                               (uint)(SUB321(auVar22 >> 0xd7,0) & 1) << 0x1a |
                               (uint)(SUB321(auVar22 >> 0xdf,0) & 1) << 0x1b |
                               (uint)(SUB321(auVar22 >> 0xe7,0) & 1) << 0x1c |
                               (uint)(SUB321(auVar22 >> 0xef,0) & 1) << 0x1d |
                               (uint)(SUB321(auVar22 >> 0xf7,0) & 1) << 0x1e |
                               (uint)(byte)(auVar22[0x1f] >> 7) << 0x1f);
    uVar4 = (uint)~uVar13;
    __n = POPCOUNT(~uVar13);
    auVar21._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])("" + ((uint)(uVar13 >> 0xc) & 0x7fff0)) +
         ZEXT116(1) * *(undefined1 (*) [16])("" + (((uint)uVar13 & 0x7fff) << 4));
    auVar21._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])("" + ((uint)(uVar13 >> 0xc) & 0x7fff0));
    auVar24._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])("" + (((ushort)(uVar13 >> 0x30) & 0x7fff) << 4)) +
         ZEXT116(1) * *(undefined1 (*) [16])("" + (((uint)(uVar13 >> 0x20) & 0x7fff) << 4));
    auVar24._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])("" + (((ushort)(uVar13 >> 0x30) & 0x7fff) << 4));
    auVar16 = vpshufb_avx2(auVar1,auVar21);
    auVar17 = vpshufb_avx2(auVar2,auVar24);
    buffer._0_8_ = auVar16._0_8_;
    buffer._8_8_ = auVar16._8_8_;
    *(undefined1 (*) [16])(buffer + (uint)POPCOUNT(uVar4 & 0xffff)) = auVar16._16_16_;
    *(undefined1 (*) [16])(buffer + (uint)POPCOUNT(uVar4)) = auVar17._0_16_;
    *(undefined1 (*) [16])(buffer + POPCOUNT(~uVar13 & 0xffffffffffff)) = auVar17._16_16_;
    memcpy(pauVar15,buffer,__n);
    pauVar15 = (undefined1 (*) [16])(*pauVar15 + __n);
  }
  (*pauVar15)[0] = '\0';
  return (long)pauVar15 - (long)out;
}

Assistant:

size_t jsonminify(const uint8_t *buf, size_t len, uint8_t *out) {
  // Useful constant masks
  const uint64_t even_bits = 0x5555555555555555ULL;
  const uint64_t odd_bits = ~even_bits;
  uint8_t *initout(out);
  uint64_t prev_iter_ends_odd_backslash =
      0ULL;                               // either 0 or 1, but a 64-bit value
  uint64_t prev_iter_inside_quote = 0ULL; // either all zeros or all ones
  size_t idx = 0;
  if (len >= 64) {
    size_t avxlen = len - 63;

    for (; idx < avxlen; idx += 64) {
      __m256i input_lo = _mm256_loadu_si256(reinterpret_cast<const __m256i *>(buf + idx + 0));
      __m256i input_hi = _mm256_loadu_si256(reinterpret_cast<const __m256i *>(buf + idx + 32));
      uint64_t bs_bits = cmp_mask_against_input_mini(input_lo, input_hi,
                                                     _mm256_set1_epi8('\\'));
      uint64_t start_edges = bs_bits & ~(bs_bits << 1);
      uint64_t even_start_mask = even_bits ^ prev_iter_ends_odd_backslash;
      uint64_t even_starts = start_edges & even_start_mask;
      uint64_t odd_starts = start_edges & ~even_start_mask;
      uint64_t even_carries = bs_bits + even_starts;
      uint64_t odd_carries;
      bool iter_ends_odd_backslash = add_overflow(
          bs_bits, odd_starts, &odd_carries);
      odd_carries |= prev_iter_ends_odd_backslash;
      prev_iter_ends_odd_backslash = iter_ends_odd_backslash ? 0x1ULL : 0x0ULL;
      uint64_t even_carry_ends = even_carries & ~bs_bits;
      uint64_t odd_carry_ends = odd_carries & ~bs_bits;
      uint64_t even_start_odd_end = even_carry_ends & odd_bits;
      uint64_t odd_start_even_end = odd_carry_ends & even_bits;
      uint64_t odd_ends = even_start_odd_end | odd_start_even_end;
      uint64_t quote_bits = cmp_mask_against_input_mini(input_lo, input_hi,
                                                        _mm256_set1_epi8('"'));
      quote_bits = quote_bits & ~odd_ends;
      uint64_t quote_mask = _mm_cvtsi128_si64(_mm_clmulepi64_si128(
          _mm_set_epi64x(0ULL, quote_bits), _mm_set1_epi8(0xFF), 0));
      quote_mask ^= prev_iter_inside_quote;
      prev_iter_inside_quote = static_cast<uint64_t>(static_cast<int64_t>(quote_mask) >> 63);// might be undefined behavior, should be fully defined in C++20, ok according to John Regher from Utah University
      const __m256i low_nibble_mask = _mm256_setr_epi8(
          //  0                           9  a   b  c  d
          16, 0, 0, 0, 0, 0, 0, 0, 0, 8, 12, 1, 2, 9, 0, 0, 16, 0, 0, 0, 0, 0,
          0, 0, 0, 8, 12, 1, 2, 9, 0, 0);
      const __m256i high_nibble_mask = _mm256_setr_epi8(
          //  0     2   3     5     7
          8, 0, 18, 4, 0, 1, 0, 1, 0, 0, 0, 3, 2, 1, 0, 0, 8, 0, 18, 4, 0, 1, 0,
          1, 0, 0, 0, 3, 2, 1, 0, 0);
      __m256i whitespace_shufti_mask = _mm256_set1_epi8(0x18);
      __m256i v_lo = _mm256_and_si256(
          _mm256_shuffle_epi8(low_nibble_mask, input_lo),
          _mm256_shuffle_epi8(high_nibble_mask,
                              _mm256_and_si256(_mm256_srli_epi32(input_lo, 4),
                                               _mm256_set1_epi8(0x7f))));

      __m256i v_hi = _mm256_and_si256(
          _mm256_shuffle_epi8(low_nibble_mask, input_hi),
          _mm256_shuffle_epi8(high_nibble_mask,
                              _mm256_and_si256(_mm256_srli_epi32(input_hi, 4),
                                               _mm256_set1_epi8(0x7f))));
      __m256i tmp_ws_lo = _mm256_cmpeq_epi8(
          _mm256_and_si256(v_lo, whitespace_shufti_mask), _mm256_set1_epi8(0));
      __m256i tmp_ws_hi = _mm256_cmpeq_epi8(
          _mm256_and_si256(v_hi, whitespace_shufti_mask), _mm256_set1_epi8(0));

      uint64_t ws_res_0 = static_cast<uint32_t>(_mm256_movemask_epi8(tmp_ws_lo));
      uint64_t ws_res_1 = _mm256_movemask_epi8(tmp_ws_hi);
      uint64_t whitespace = ~(ws_res_0 | (ws_res_1 << 32));
      whitespace &= ~quote_mask;
      int mask1 = whitespace & 0xFFFF;
      int mask2 = (whitespace >> 16) & 0xFFFF;
      int mask3 = (whitespace >> 32) & 0xFFFF;
      int mask4 = (whitespace >> 48) & 0xFFFF;
      int pop1 = hamming((~whitespace) & 0xFFFF);
      int pop2 = hamming((~whitespace) & UINT64_C(0xFFFFFFFF));
      int pop3 = hamming((~whitespace) & UINT64_C(0xFFFFFFFFFFFF));
      int pop4 = hamming((~whitespace));
      __m256i vmask1 =
          _mm256_loadu2_m128i(reinterpret_cast<const __m128i *>(mask128_epi8) + (mask2 & 0x7FFF),
                              reinterpret_cast<const __m128i *>(mask128_epi8) + (mask1 & 0x7FFF));
      __m256i vmask2 =
          _mm256_loadu2_m128i(reinterpret_cast<const __m128i *>(mask128_epi8) + (mask4 & 0x7FFF),
                              reinterpret_cast<const __m128i *>(mask128_epi8) + (mask3 & 0x7FFF));
      __m256i result1 = _mm256_shuffle_epi8(input_lo, vmask1);
      __m256i result2 = _mm256_shuffle_epi8(input_hi, vmask2);
      _mm256_storeu2_m128i(reinterpret_cast<__m128i *>(out + pop1), reinterpret_cast<__m128i *>(out), result1);
      _mm256_storeu2_m128i(reinterpret_cast<__m128i *>(out + pop3), reinterpret_cast<__m128i *>(out + pop2),
                           result2);
      out += pop4;
    }
  }
  // we finish off the job... copying and pasting the code is not ideal here,
  // but it gets the job done.
  if (idx < len) {
    uint8_t buffer[64];
    memset(buffer, 0, 64);
    memcpy(buffer, buf + idx, len - idx);
    __m256i input_lo = _mm256_loadu_si256(reinterpret_cast<const __m256i *>(buffer));
    __m256i input_hi = _mm256_loadu_si256(reinterpret_cast<const __m256i *>(buffer + 32));
    uint64_t bs_bits =
        cmp_mask_against_input_mini(input_lo, input_hi, _mm256_set1_epi8('\\'));
    uint64_t start_edges = bs_bits & ~(bs_bits << 1);
    uint64_t even_start_mask = even_bits ^ prev_iter_ends_odd_backslash;
    uint64_t even_starts = start_edges & even_start_mask;
    uint64_t odd_starts = start_edges & ~even_start_mask;
    uint64_t even_carries = bs_bits + even_starts;
    uint64_t odd_carries;
    //bool iter_ends_odd_backslash = 
	add_overflow( bs_bits, odd_starts, &odd_carries);
    odd_carries |= prev_iter_ends_odd_backslash;
    //prev_iter_ends_odd_backslash = iter_ends_odd_backslash ? 0x1ULL : 0x0ULL; // we never use it
    uint64_t even_carry_ends = even_carries & ~bs_bits;
    uint64_t odd_carry_ends = odd_carries & ~bs_bits;
    uint64_t even_start_odd_end = even_carry_ends & odd_bits;
    uint64_t odd_start_even_end = odd_carry_ends & even_bits;
    uint64_t odd_ends = even_start_odd_end | odd_start_even_end;
    uint64_t quote_bits =
        cmp_mask_against_input_mini(input_lo, input_hi, _mm256_set1_epi8('"'));
    quote_bits = quote_bits & ~odd_ends;
    uint64_t quote_mask = _mm_cvtsi128_si64(_mm_clmulepi64_si128(
        _mm_set_epi64x(0ULL, quote_bits), _mm_set1_epi8(0xFF), 0));
    quote_mask ^= prev_iter_inside_quote;
    // prev_iter_inside_quote = (uint64_t)((int64_t)quote_mask >> 63);// we don't need this anymore

    __m256i mask_20 = _mm256_set1_epi8(0x20); // c==32
    __m256i mask_70 =
        _mm256_set1_epi8(0x70); // adding 0x70 does not check low 4-bits
    // but moves any value >= 16 above 128

    __m256i lut_cntrl = _mm256_setr_epi8(
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xFF, 0xFF, 0x00,
        0x00, 0xFF, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0xFF, 0xFF, 0x00, 0x00, 0xFF, 0x00, 0x00);

    __m256i tmp_ws_lo = _mm256_or_si256(
        _mm256_cmpeq_epi8(mask_20, input_lo),
        _mm256_shuffle_epi8(lut_cntrl, _mm256_adds_epu8(mask_70, input_lo)));
    __m256i tmp_ws_hi = _mm256_or_si256(
        _mm256_cmpeq_epi8(mask_20, input_hi),
        _mm256_shuffle_epi8(lut_cntrl, _mm256_adds_epu8(mask_70, input_hi)));
    uint64_t ws_res_0 = static_cast<uint32_t>(_mm256_movemask_epi8(tmp_ws_lo));
    uint64_t ws_res_1 = _mm256_movemask_epi8(tmp_ws_hi);
    uint64_t whitespace = (ws_res_0 | (ws_res_1 << 32));
    whitespace &= ~quote_mask;

    if (len - idx < 64) {
      whitespace |= UINT64_C(0xFFFFFFFFFFFFFFFF) << (len - idx);
    }
    int mask1 = whitespace & 0xFFFF;
    int mask2 = (whitespace >> 16) & 0xFFFF;
    int mask3 = (whitespace >> 32) & 0xFFFF;
    int mask4 = (whitespace >> 48) & 0xFFFF;
    int pop1 = hamming((~whitespace) & 0xFFFF);
    int pop2 = hamming((~whitespace) & UINT64_C(0xFFFFFFFF));
    int pop3 = hamming((~whitespace) & UINT64_C(0xFFFFFFFFFFFF));
    int pop4 = hamming((~whitespace));
    __m256i vmask1 =
        _mm256_loadu2_m128i(reinterpret_cast<const __m128i *>(mask128_epi8) + (mask2 & 0x7FFF),
                            reinterpret_cast<const __m128i *>(mask128_epi8) + (mask1 & 0x7FFF));
    __m256i vmask2 =
        _mm256_loadu2_m128i(reinterpret_cast<const __m128i *>(mask128_epi8) + (mask4 & 0x7FFF),
                            reinterpret_cast<const __m128i *>(mask128_epi8) + (mask3 & 0x7FFF));
    __m256i result1 = _mm256_shuffle_epi8(input_lo, vmask1);
    __m256i result2 = _mm256_shuffle_epi8(input_hi, vmask2);
    _mm256_storeu2_m128i(reinterpret_cast<__m128i *>(buffer + pop1), reinterpret_cast<__m128i *>(buffer),
                         result1);
    _mm256_storeu2_m128i(reinterpret_cast<__m128i *>(buffer + pop3), reinterpret_cast<__m128i *>(buffer + pop2),
                         result2);
    memcpy(out, buffer, pop4);
    out += pop4;
  }
  *out = '\0';// NULL termination
  return out - initout;
}